

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O2

err_t cmdSigSelfVerify(octet *pubkey,size_t pubkey_len)

{
  err_t eVar1;
  size_t in_RAX;
  char *path;
  size_t count;
  
  count = in_RAX;
  eVar1 = cmdSysModulePath((char *)0x0,&count);
  if (eVar1 == 0) {
    path = (char *)blobCreate(count);
    if (path == (char *)0x0) {
      eVar1 = 0x6e;
    }
    else {
      eVar1 = cmdSysModulePath(path,&count);
      if (eVar1 == 0) {
        eVar1 = cmdSigVerify(path,path,pubkey,pubkey_len);
      }
      blobClose(path);
    }
  }
  return eVar1;
}

Assistant:

err_t cmdSigSelfVerify(const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	size_t count;
	char* buf;
	// определить имя исполняемого модуля
	code = cmdSysModulePath(0, &count);
	ERR_CALL_CHECK(code);
	code = cmdBlobCreate(buf, count);
	ERR_CALL_CHECK(code);
	code = cmdSysModulePath(buf, &count);
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// проверить подпись
	code = cmdSigVerify(buf, buf, pubkey, pubkey_len);
	// завершить
	cmdBlobClose(buf);
	return code;
}